

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SmallHTTPPartialMatchPCRE(int n)

{
  Arg local_a8 [2];
  StringPiece local_88;
  int local_74;
  undefined1 local_70 [4];
  int i;
  PCRE re;
  StringPiece a;
  int n_local;
  
  StringPiece::StringPiece((StringPiece *)&re.stack_limit_);
  PCRE::PCRE((PCRE *)local_70,"(?-s)^(?:GET|POST) +([^ ]+) HTTP");
  for (local_74 = 0; local_74 < n; local_74 = local_74 + 1) {
    StringPiece::StringPiece(&local_88,(string *)smallhttp_text_abi_cxx11_);
    PCRE::Arg::Arg(local_a8,(StringPiece *)&re.stack_limit_);
    PCRE::PartialMatchFunctor::operator()
              ((PartialMatchFunctor *)&PCRE::PartialMatch,&local_88,(PCRE *)local_70,local_a8,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
               (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
  }
  PCRE::~PCRE((PCRE *)local_70);
  return;
}

Assistant:

void SmallHTTPPartialMatchPCRE(int n) {
  StringPiece a;
  PCRE re("(?-s)^(?:GET|POST) +([^ ]+) HTTP");
  for (int i = 0; i < n; i++) {
    PCRE::PartialMatch(smallhttp_text, re, &a);
  }
}